

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

void traitor_pulse(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  long in_RSI;
  CHAR_DATA *in_RDI;
  AFFECT_DATA *in_stack_00000028;
  CHAR_DATA *in_stack_00000030;
  
  if (*(long *)(in_RSI + 8) == 0) {
    affect_remove(in_stack_00000030,in_stack_00000028);
  }
  else {
    bVar1 = is_same_group(in_RDI,*(CHAR_DATA **)(in_RSI + 8));
    if ((!bVar1) && (*(short *)(in_RSI + 0x20) == -1)) {
      *(undefined2 *)(in_RSI + 0x20) = 10;
    }
  }
  return;
}

Assistant:

void traitor_pulse(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (!af->owner)
	{
		affect_remove(ch, af);
		return;
	}

	if (!is_same_group(ch, af->owner) && af->duration == -1)
	{
		af->duration = 10;
		return;
	}
}